

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

SPIRType * __thiscall
spirv_cross::CompilerGLSL::binary_op_bitcast_helper
          (SPIRType *__return_storage_ptr__,CompilerGLSL *this,string *cast_op0,string *cast_op1,
          BaseType *input_type,uint32_t op0,uint32_t op1,bool skip_cast_if_equal_type)

{
  bool local_101;
  bool local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_70;
  undefined1 local_4a;
  bool local_49;
  SPIRType *pSStack_48;
  bool cast;
  SPIRType *type1;
  SPIRType *type0;
  bool skip_cast_if_equal_type_local;
  BaseType *pBStack_30;
  uint32_t op0_local;
  BaseType *input_type_local;
  string *cast_op1_local;
  string *cast_op0_local;
  CompilerGLSL *this_local;
  SPIRType *expected_type;
  
  type0._3_1_ = skip_cast_if_equal_type;
  type0._4_4_ = op0;
  pBStack_30 = input_type;
  input_type_local = (BaseType *)cast_op1;
  cast_op1_local = cast_op0;
  cast_op0_local = (string *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  type1 = Compiler::expression_type(&this->super_Compiler,op0);
  pSStack_48 = Compiler::expression_type(&this->super_Compiler,op1);
  local_e1 = true;
  if (type1->basetype == pSStack_48->basetype) {
    local_101 = false;
    if ((type0._3_1_ & 1) == 0) {
      local_101 = type1->basetype != *pBStack_30;
    }
    local_e1 = local_101;
  }
  local_49 = local_e1;
  local_4a = 0;
  SPIRType::SPIRType(__return_storage_ptr__,*(Op *)&(type1->super_IVariant).field_0xc);
  __return_storage_ptr__->basetype = *pBStack_30;
  __return_storage_ptr__->vecsize = type1->vecsize;
  __return_storage_ptr__->columns = type1->columns;
  __return_storage_ptr__->width = type1->width;
  if ((local_49 & 1U) == 0) {
    to_enclosed_unpacked_expression_abi_cxx11_(&local_c0,this,type0._4_4_,true);
    ::std::__cxx11::string::operator=((string *)cast_op1_local,(string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    to_enclosed_unpacked_expression_abi_cxx11_(&local_e0,this,op1,true);
    ::std::__cxx11::string::operator=((string *)input_type_local,(string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    *pBStack_30 = type1->basetype;
  }
  else {
    bitcast_glsl_abi_cxx11_(&local_70,this,__return_storage_ptr__,type0._4_4_);
    ::std::__cxx11::string::operator=((string *)cast_op1_local,(string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    bitcast_glsl_abi_cxx11_(&local_a0,this,__return_storage_ptr__,op1);
    ::std::__cxx11::string::operator=((string *)input_type_local,(string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

SPIRType CompilerGLSL::binary_op_bitcast_helper(string &cast_op0, string &cast_op1, SPIRType::BaseType &input_type,
                                                uint32_t op0, uint32_t op1, bool skip_cast_if_equal_type)
{
	auto &type0 = expression_type(op0);
	auto &type1 = expression_type(op1);

	// We have to bitcast if our inputs are of different type, or if our types are not equal to expected inputs.
	// For some functions like OpIEqual and INotEqual, we don't care if inputs are of different types than expected
	// since equality test is exactly the same.
	bool cast = (type0.basetype != type1.basetype) || (!skip_cast_if_equal_type && type0.basetype != input_type);

	// Create a fake type so we can bitcast to it.
	// We only deal with regular arithmetic types here like int, uints and so on.
	SPIRType expected_type{type0.op};
	expected_type.basetype = input_type;
	expected_type.vecsize = type0.vecsize;
	expected_type.columns = type0.columns;
	expected_type.width = type0.width;

	if (cast)
	{
		cast_op0 = bitcast_glsl(expected_type, op0);
		cast_op1 = bitcast_glsl(expected_type, op1);
	}
	else
	{
		// If we don't cast, our actual input type is that of the first (or second) argument.
		cast_op0 = to_enclosed_unpacked_expression(op0);
		cast_op1 = to_enclosed_unpacked_expression(op1);
		input_type = type0.basetype;
	}

	return expected_type;
}